

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_spin_mutex.hpp
# Opt level: O0

bool __thiscall
yamc::spin::basic_mutex<yamc::backoff::exponential<4000U>_>::try_lock
          (basic_mutex<yamc::backoff::exponential<4000U>_> *this)

{
  memory_order mVar1;
  __atomic_base<int> local_54;
  basic_mutex<yamc::backoff::exponential<4000U>_> *pbStack_50;
  int expected;
  basic_mutex<yamc::backoff::exponential<4000U>_> *this_local;
  __atomic_base<int> *local_40;
  basic_mutex<yamc::backoff::exponential<4000U>_> *local_38;
  bool local_29;
  
  local_54._M_i = 0;
  local_40 = &local_54;
  this_local._4_4_ = 1;
  this_local._0_4_ = 5;
  pbStack_50 = this;
  local_38 = this;
  mVar1 = std::__cmpexch_failure_order(memory_order_seq_cst);
  switch(0x12330e) {
  default:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      local_29 = local_54._M_i == (this->state_).super___atomic_base<int>._M_i;
      if (local_29) {
        (this->state_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      local_29 = local_54._M_i == (this->state_).super___atomic_base<int>._M_i;
      if (local_29) {
        (this->state_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_29 = local_54._M_i == (this->state_).super___atomic_base<int>._M_i;
      if (local_29) {
        (this->state_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
    }
    break;
  case 2:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      local_29 = local_54._M_i == (this->state_).super___atomic_base<int>._M_i;
      if (local_29) {
        (this->state_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      local_29 = local_54._M_i == (this->state_).super___atomic_base<int>._M_i;
      if (local_29) {
        (this->state_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_29 = local_54._M_i == (this->state_).super___atomic_base<int>._M_i;
      if (local_29) {
        (this->state_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
    }
    break;
  case 3:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      local_29 = local_54._M_i == (this->state_).super___atomic_base<int>._M_i;
      if (local_29) {
        (this->state_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      local_29 = local_54._M_i == (this->state_).super___atomic_base<int>._M_i;
      if (local_29) {
        (this->state_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_29 = local_54._M_i == (this->state_).super___atomic_base<int>._M_i;
      if (local_29) {
        (this->state_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
    }
    break;
  case 4:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      local_29 = local_54._M_i == (this->state_).super___atomic_base<int>._M_i;
      if (local_29) {
        (this->state_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      local_29 = local_54._M_i == (this->state_).super___atomic_base<int>._M_i;
      if (local_29) {
        (this->state_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_29 = local_54._M_i == (this->state_).super___atomic_base<int>._M_i;
      if (local_29) {
        (this->state_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
    }
  }
  return local_29;
}

Assistant:

bool try_lock()
  {
    int expected = 0;
    return state_.compare_exchange_weak(expected, 1);
  }